

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  ushort uVar1;
  char *pcVar2;
  ushort *puVar3;
  Context *pCVar4;
  pointer pcVar5;
  OneofDescriptor *oneof;
  Nullable<const_char_*> pcVar6;
  size_t sVar7;
  string *psVar8;
  void *pvVar9;
  bool bVar10;
  int iVar11;
  JavaType type;
  ImmutableFieldGenerator *pIVar12;
  reference ppVar13;
  Nonnull<char_*> pcVar14;
  Descriptor *pDVar15;
  Nonnull<const_char_*> pcVar16;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  ImmutableMessageGenerator *extraout_RDX_01;
  ImmutableMessageGenerator *extraout_RDX_02;
  ImmutableMessageGenerator *extraout_RDX_03;
  ImmutableMessageGenerator *extraout_RDX_04;
  FieldDescriptor *pFVar17;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ImmutableMessageGenerator *pIVar23;
  long lVar24;
  char *pcVar25;
  uint uVar26;
  string_view text;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  const_iterator other;
  string_view begin_varname_01;
  string_view text_07;
  string_view begin_varname_02;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view begin_varname_03;
  string_view text_13;
  string_view begin_varname_04;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view text_22;
  iterator iVar27;
  string_view end_varname;
  string_view end_varname_00;
  string_view java_class_name;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view text_23;
  string_view text_24;
  string_view format;
  string_view text_25;
  string_view text_26;
  string_view text_27;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  string_view text_31;
  string_view text_32;
  ImmutableMessageGenerator messageGenerator;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string builder_type;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  undefined1 local_1a0 [16];
  btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *local_e8;
  int local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
  local_b8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  char *local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (pDVar15->containing_type_ == (Descriptor *)0x0) {
    bVar10 = NestedInFileClass(pDVar15,true);
    pcVar25 = anon_var_dwarf_a12c75 + 5;
    if (bVar10) {
      pcVar25 = "static ";
    }
  }
  else {
    pcVar25 = "static ";
  }
  local_a8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_a8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_e8 = (btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
              *)0x1476ff0;
  local_a8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_1a0,&local_a8,(char (*) [7])"static");
  pcVar2 = *(char **)(local_1a0._8_8_ + 0x18);
  uVar20 = local_1a0._8_8_ + 0x10;
  strlen(pcVar25);
  std::__cxx11::string::_M_replace(uVar20,0,pcVar2,(ulong)pcVar25);
  puVar3 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_1a0._0_8_ = &local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,(long)puVar3 + ~(ulong)*puVar3,(long)puVar3 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_d8,&local_a8,(char (*) [10])0x134d25a);
  std::__cxx11::string::operator=((string *)(local_d8._M_string_length + 0x10),(string *)local_1a0);
  pDVar15 = extraout_RDX;
  if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
    pDVar15 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)local_1a0,(java *)(this->super_MessageGenerator).descriptor_,pDVar15);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_d8,&local_a8,(char (*) [17])"extra_interfaces");
  std::__cxx11::string::operator=((string *)(local_d8._M_string_length + 0x10),(string *)local_1a0);
  if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
  }
  bVar10 = (((this->super_MessageGenerator).descriptor_)->options_->field_0)._impl_.deprecated_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_1a0,&local_a8,(char (*) [12])"deprecation");
  pcVar25 = anon_var_dwarf_a12c75 + 5;
  if (bVar10 != false) {
    pcVar25 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            (local_1a0._8_8_ + 0x10,0,*(char **)(local_1a0._8_8_ + 0x18),(ulong)pcVar25);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  pCVar4 = this->context_;
  local_80[4] = (pCVar4->options_).opensource_runtime;
  local_80[5] = (pCVar4->options_).annotate_code;
  local_80[0] = (pCVar4->options_).generate_immutable_code;
  local_80[1] = (pCVar4->options_).generate_mutable_code;
  local_80[2] = (pCVar4->options_).generate_shared_code;
  local_80[3] = (pCVar4->options_).enforce_lite;
  pcVar5 = (pCVar4->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar5,
             pcVar5 + (pCVar4->options_).annotation_list_file._M_string_length);
  pcVar5 = (pCVar4->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar5,
             pcVar5 + (pCVar4->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar4->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar4->options_).jvm_dsl;
  WriteMessageDocComment(printer,pDVar15,(Options *)local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  pCVar4 = this->context_;
  local_1a0._0_8_ = &local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,anon_var_dwarf_a12c75 + 5);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (pCVar4,printer,pDVar15,true,(string *)local_1a0);
  if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
  }
  if ((this->context_->options_).opensource_runtime == false) {
    text._M_str = "@com.google.protobuf.Internal.ProtoNonnullApi\n";
    text._M_len = 0x2e;
    io::Printer::Print<>(printer,text);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  if (((this->super_MessageGenerator).descriptor_)->extension_range_count_ < 1) {
    text_25._M_str = "$deprecation$public $static$final class $classname$ extends\n";
    text_25._M_len = 0x3c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_a8,text_25);
    begin_varname_00._M_str = "classname";
    begin_varname_00._M_len = 9;
    end_varname_00._M_str = "classname";
    end_varname_00._M_len = 9;
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,begin_varname_00,end_varname_00,(this->super_MessageGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_26._M_str =
         "    com.google.protobuf.GeneratedMessage implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_26._M_len = 0x66;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_a8,text_26);
    pcVar25 = &DAT_0000002f;
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)local_d8._M_string_length,0x13781a7)
    ;
  }
  else {
    text_23._M_str = "$deprecation$public $static$final class $classname$ extends\n";
    text_23._M_len = 0x3c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_a8,text_23);
    pDVar15 = (this->super_MessageGenerator).descriptor_;
    begin_varname._M_str = "classname";
    begin_varname._M_len = 9;
    end_varname._M_str = "classname";
    end_varname._M_len = 9;
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,begin_varname,end_varname,pDVar15,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_24._M_str =
         "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n      $classname$> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_24._M_len = 0x8c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_a8,text_24);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_108,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
    local_1a0._8_8_ = (slot_type *)0x0;
    local_190.root_._0_1_ = false;
    local_148._M_dataplus._M_p = (pointer)local_108._M_string_length;
    local_148._M_string_length = (size_type)local_108._M_dataplus._M_p;
    pcVar25 = (char *)0x1;
    format._M_str = (char *)&local_148;
    format._M_len = (size_t)"com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>";
    local_1a0._0_8_ = &local_190;
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)local_1a0,(Nonnull<std::string_*>)&DAT_0000003d,format,
               (Nullable<const_absl::string_view_*>)0x1,(size_t)pDVar15);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)local_1a0);
    if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
         *)local_1a0._0_8_ != &local_190) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  text_00._M_str = "private static final long serialVersionUID = 0L;\n";
  text_00._M_len = 0x31;
  io::Printer::Print<>(printer,text_00);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_01._M_str = "static {\n";
  text_01._M_len = 9;
  io::Printer::Print<>(printer,text_01);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  puVar3 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  uVar1 = *puVar3;
  java_class_name._M_len = (long)puVar3 + ~(ulong)uVar1;
  java_class_name._M_str = pcVar25;
  PrintGencodeVersionValidator
            ((java *)printer,(Printer *)(ulong)(this->context_->options_).opensource_runtime,
             SUB21(uVar1,0),java_class_name);
  io::Printer::Outdent(printer);
  text_02._M_str = "}\n";
  text_02._M_len = 2;
  io::Printer::Print<>(printer,text_02);
  puVar3 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_1a0._0_8_ = ZEXT28(*puVar3);
  local_1a0._8_8_ = (long)puVar3 + ~local_1a0._0_8_;
  text_03._M_str =
       "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
  ;
  text_03._M_len = 0x6f;
  io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[12],std::__cxx11::string>
            (printer,text_03,(char (*) [10])0x134d25a,
             (basic_string_view<char,_std::char_traits<char>_> *)local_1a0,
             (char (*) [12])"buildertype",&local_d8);
  puVar3 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_1a0._0_8_ = ZEXT28(*puVar3);
  local_1a0._8_8_ = (long)puVar3 + ~local_1a0._0_8_;
  text_04._M_str = "private $classname$() {\n";
  text_04._M_len = 0x18;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_04,(char (*) [10])0x134d25a,
             (basic_string_view<char,_std::char_traits<char>_> *)local_1a0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateInitializers(this,printer);
  io::Printer::Outdent(printer);
  text_05._M_str = "}\n\n";
  text_05._M_len = 3;
  io::Printer::Print<>(printer,text_05);
  GenerateDescriptorMethods(this,printer);
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar15->enum_type_count_) {
    lVar21 = 0;
    lVar24 = 0;
    do {
      EnumNonLiteGenerator::EnumNonLiteGenerator
                ((EnumNonLiteGenerator *)local_1a0,
                 (EnumDescriptor *)(&pDVar15->enum_types_->super_SymbolBase + lVar21),true,
                 this->context_);
      EnumNonLiteGenerator::Generate((EnumNonLiteGenerator *)local_1a0,printer);
      local_1a0._0_8_ = &PTR__EnumNonLiteGenerator_01970670;
      if ((Context *)local_178._M_allocated_capacity != (Context *)0x0) {
        operator_delete((void *)local_178._M_allocated_capacity,
                        (long)local_168.descriptor_ - local_178._0_8_);
      }
      pvVar9 = (void *)CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_);
      if (pvVar9 != (void *)0x0) {
        operator_delete(pvVar9,local_190.size_ - (long)pvVar9);
      }
      lVar24 = lVar24 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x58;
    } while (lVar24 < pDVar15->enum_type_count_);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  pIVar23 = this;
  if (0 < pDVar15->nested_type_count_) {
    lVar21 = 0;
    lVar24 = 0;
    do {
      if (*(char *)(*(long *)((long)&pDVar15->nested_types_->options_ + lVar21) + 0x53) == '\0') {
        pDVar15 = (this->super_MessageGenerator).descriptor_;
        lVar22 = (long)pDVar15->nested_type_count_;
        if (lVar24 < lVar22) {
          pcVar16 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (lVar24,lVar22,"index < nested_type_count()");
        }
        if (pcVar16 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa8a,pcVar16);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_108);
        }
        ImmutableMessageGenerator
                  ((ImmutableMessageGenerator *)local_1a0,
                   (Descriptor *)(&pDVar15->nested_types_->super_SymbolBase + lVar21),this->context_
                  );
        GenerateInterface((ImmutableMessageGenerator *)local_1a0,printer);
        Generate((ImmutableMessageGenerator *)local_1a0,printer);
        local_1a0._0_8_ = &PTR__ImmutableMessageGenerator_019703f0;
        FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
        ~FieldGeneratorMap(&local_168);
        local_1a0._0_8_ = &PTR__MessageGenerator_019703a8;
        absl::lts_20250127::container_internal::
        btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        ::~btree(&local_190);
        pIVar23 = extraout_RDX_01;
      }
      lVar24 = lVar24 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0xa0;
    } while (lVar24 < pDVar15->nested_type_count_);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (pDVar15->field_count_ < 1) {
    iVar18 = 0;
  }
  else {
    lVar24 = 0;
    lVar21 = 0;
    iVar18 = 0;
    do {
      pIVar12 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                          (&this->field_generators_,
                           (FieldDescriptor *)(&pDVar15->fields_->super_SymbolBase + lVar24));
      iVar11 = (*(pIVar12->super_FieldGenerator)._vptr_FieldGenerator[5])(pIVar12);
      iVar18 = iVar18 + iVar11;
      lVar21 = lVar21 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar24 = lVar24 + 0x58;
      pIVar23 = extraout_RDX_02;
    } while (lVar21 < pDVar15->field_count_);
  }
  if (0 < iVar18) {
    uVar19 = iVar18 + 0x1fU >> 5;
    uVar26 = 1;
    if (1 < uVar19) {
      uVar26 = uVar19;
    }
    uVar19 = 0;
    do {
      GetBitFieldName_abi_cxx11_((string *)local_1a0,(java *)(ulong)uVar19,(int)pIVar23);
      text_06._M_str = "private int $bit_field_name$;\n";
      text_06._M_len = 0x1e;
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,text_06,(char (*) [15])"bit_field_name",(string *)local_1a0);
      pIVar23 = extraout_RDX_03;
      if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           *)local_1a0._0_8_ != &local_190) {
        operator_delete((void *)local_1a0._0_8_,
                        CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
        pIVar23 = extraout_RDX_04;
      }
      uVar19 = uVar19 + 1;
    } while (uVar26 != uVar19);
  }
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  local_108.field_2._M_allocated_capacity = (size_type)local_e8;
  this_00 = &(this->super_MessageGenerator).oneofs_;
  iVar27 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
  local_b8.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar27.node_;
  local_b8.position_ = iVar27.position_;
  iVar27 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00);
  local_e8 = iVar27.node_;
  local_dc = iVar27.position_;
  while( true ) {
    other.position_ = local_dc;
    other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                   *)local_e8;
    other._12_4_ = 0;
    bVar10 = absl::lts_20250127::container_internal::
             btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
             ::Equals(&local_b8,other);
    if (bVar10) break;
    ppVar13 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::operator*(&local_b8);
    oneof = ppVar13->second;
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_1a0,&local_108,(char (*) [11])0x132d046);
    std::__cxx11::string::_M_assign((string *)(local_1a0._8_8_ + 0x10));
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_1a0,&local_108,(char (*) [23])"oneof_capitalized_name");
    std::__cxx11::string::_M_assign((string *)(local_1a0._8_8_ + 0x10));
    pcVar14 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        ((int)((ulong)((long)oneof - (long)oneof->containing_type_->oneof_decls_) >>
                              3) * -0x49249249,(Nonnull<char_*>)&local_190);
    local_1a0._0_8_ = pcVar14 + -(long)&local_190;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_1a0._8_8_ = (slot_type *)&local_190;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,(slot_type *)&local_190,pcVar14);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[12]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_128,&local_108,(char (*) [12])"oneof_index");
    std::__cxx11::string::operator=
              ((string *)(local_128._M_string_length + 0x10),(string *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                               local_148.field_2._M_local_buf[0]) + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[2]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_1a0,&local_108,(char (*) [2])0x122a33e);
    std::__cxx11::string::_M_replace
              ((ulong)(local_1a0._8_8_ + 0x10),0,
               (char *)((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                         *)(local_1a0._8_8_ + 0x18))->root_,0x1141ae9);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[2]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_1a0,&local_108,(char (*) [2])0x12347b2);
    std::__cxx11::string::_M_replace
              ((ulong)(local_1a0._8_8_ + 0x10),0,
               (char *)((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                         *)(local_1a0._8_8_ + 0x18))->root_,0x1141ae9);
    text_27._M_str =
         "private int $oneof_name$Case_ = 0;\n@SuppressWarnings(\"serial\")\nprivate java.lang.Object $oneof_name$_;\n"
    ;
    text_27._M_len = 0x67;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_108,text_27);
    text_28._M_str =
         "public enum ${$$oneof_capitalized_name$Case$}$\n    implements com.google.protobuf.Internal.EnumLite,\n        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n"
    ;
    text_28._M_len = 0xa5;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_108,text_28);
    begin_varname_01._M_str = "{";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "}";
    end_varname_01._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_01,end_varname_01,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    if (0 < oneof->field_count_) {
      lVar24 = 0;
      lVar21 = 0;
      do {
        pFVar17 = oneof->fields_;
        local_88 = anon_var_dwarf_a12c75 + 5;
        if (*(char *)(*(long *)((long)&pFVar17->options_ + lVar24) + 0x85) != '\0') {
          local_88 = "@java.lang.Deprecated ";
        }
        puVar3 = *(ushort **)((long)&(pFVar17->all_names_).payload_ + lVar24);
        uVar1 = *puVar3;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        local_148._M_string_length = 0;
        local_148.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::resize((ulong)&local_148,(char)uVar1);
        absl::lts_20250127::ascii_internal::AsciiStrToUpper
                  (local_148._M_dataplus._M_p,(Nullable<const_char_*>)((long)puVar3 + ~(ulong)uVar1)
                   ,(ulong)uVar1);
        pcVar14 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (*(int32_t *)((long)&pFVar17->number_ + lVar24),
                             (Nonnull<char_*>)&local_190);
        local_1a0._0_8_ = pcVar14 + -(long)&local_190;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        local_1a0._8_8_ = (slot_type *)&local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,(slot_type *)&local_190,pcVar14);
        text_07._M_str = "$deprecation$$field_name$($field_number$),\n";
        text_07._M_len = 0x2b;
        io::Printer::
        Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                  (printer,text_07,(char (*) [12])"deprecation",&local_88,(char (*) [11])0x13782c1,
                   &local_148,(char (*) [13])0x1321453,&local_128);
        if ((string_view *)local_128._M_dataplus._M_p != (string_view *)&local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,
                          CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                   local_128.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        begin_varname_02._M_str = "field_name";
        begin_varname_02._M_len = 10;
        end_varname_02._M_str = "field_name";
        end_varname_02._M_len = 10;
        io::Printer::Annotate<google::protobuf::FieldDescriptor>
                  (printer,begin_varname_02,end_varname_02,
                   (FieldDescriptor *)(&pFVar17->super_SymbolBase + lVar24),
                   (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
        lVar21 = lVar21 + 1;
        lVar24 = lVar24 + 0x58;
      } while (lVar21 < oneof->field_count_);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_148,&local_108,(char (*) [11])0x132d046);
    pcVar6 = *(Nullable<const_char_*> *)(local_148._M_string_length + 0x10);
    sVar7 = *(size_t *)(local_148._M_string_length + 0x18);
    local_1a0._0_8_ = &local_190;
    local_1a0._8_8_ = (slot_type *)0x0;
    local_190.root_._0_1_ = false;
    std::__cxx11::string::resize((ulong)local_1a0,(char)sVar7);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)local_1a0._0_8_,pcVar6,sVar7);
    text_08._M_str = "$cap_oneof_name$_NOT_SET(0);\n";
    text_08._M_len = 0x1d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_08,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
    if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
         *)local_1a0._0_8_ != &local_190) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
    }
    text_29._M_str =
         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
    ;
    text_29._M_len = 99;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_108,text_29);
    if ((this->context_->options_).opensource_runtime == true) {
      text_30._M_str =
           "/**\n * @param value The number of the enum to look for.\n * @return The enum associated with the given number.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\n"
      ;
      text_30._M_len = 0x11a;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_108,text_30);
    }
    if ((this->context_->options_).opensource_runtime == false) {
      text_09._M_str = "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n";
      text_09._M_len = 0x37;
      io::Printer::Print<>(printer,text_09);
    }
    text_31._M_str =
         "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n";
    text_31._M_len = 0x55;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_108,text_31);
    if (0 < oneof->field_count_) {
      lVar24 = 8;
      lVar21 = 0;
      do {
        pFVar17 = oneof->fields_;
        pcVar14 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                            (*(int32_t *)((long)pFVar17 + lVar24 + -4),(Nonnull<char_*>)&local_190);
        local_1a0._0_8_ = pcVar14 + -(long)&local_190;
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        local_1a0._8_8_ = (slot_type *)&local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,(slot_type *)&local_190,pcVar14);
        puVar3 = *(ushort **)(&pFVar17->super_SymbolBase + lVar24);
        uVar1 = *puVar3;
        local_128._M_string_length = 0;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        local_128.field_2._M_local_buf[0] = false;
        std::__cxx11::string::resize((ulong)&local_128,(char)uVar1);
        absl::lts_20250127::ascii_internal::AsciiStrToUpper
                  (local_128._M_dataplus._M_p,(Nullable<const_char_*>)((long)puVar3 + ~(ulong)uVar1)
                   ,(ulong)uVar1);
        text_10._M_str = "    case $field_number$: return $field_name$;\n";
        text_10._M_len = 0x2e;
        io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                  (printer,text_10,(char (*) [13])0x1321453,&local_148,(char (*) [11])0x13782c1,
                   &local_128);
        if ((string_view *)local_128._M_dataplus._M_p != (string_view *)&local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,
                          CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                   local_128.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                   local_148.field_2._M_local_buf[0]) + 1);
        }
        lVar21 = lVar21 + 1;
        lVar24 = lVar24 + 0x58;
      } while (lVar21 < oneof->field_count_);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_148,&local_108,(char (*) [11])0x132d046);
    pcVar6 = *(Nullable<const_char_*> *)(local_148._M_string_length + 0x10);
    sVar7 = *(size_t *)(local_148._M_string_length + 0x18);
    local_1a0._0_8_ = &local_190;
    local_1a0._8_8_ = (slot_type *)0x0;
    local_190.root_._0_1_ = false;
    std::__cxx11::string::resize((ulong)local_1a0,(char)sVar7);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)local_1a0._0_8_,pcVar6,sVar7);
    text_11._M_str =
         "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
    ;
    text_11._M_len = 0x7d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_11,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
    if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
         *)local_1a0._0_8_ != &local_190) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
    }
    io::Printer::Outdent(printer);
    text_12._M_str = "};\n\n";
    text_12._M_len = 4;
    io::Printer::Print<>(printer,text_12);
    text_32._M_str =
         "public $oneof_capitalized_name$Case\n${$get$oneof_capitalized_name$Case$}$() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\n"
    ;
    text_32._M_len = 0x9c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_108,text_32);
    begin_varname_03._M_str = "{";
    begin_varname_03._M_len = 1;
    end_varname_03._M_str = "}";
    end_varname_03._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_03,end_varname_03,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::increment(&local_b8);
  }
  pcVar25 = (((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  pFVar17 = (FieldDescriptor *)(ulong)*(ushort *)(pcVar25 + 2);
  if (pFVar17 == (FieldDescriptor *)&DAT_00000013) {
    pIVar23 = (ImmutableMessageGenerator *)(pcVar25 + -0x14);
    iVar18 = bcmp(pIVar23,"google.protobuf.Any",0x13);
    pFVar17 = extraout_RDX_05;
    if (iVar18 == 0) {
      GenerateAnyMethods(pIVar23,printer);
      pFVar17 = extraout_RDX_06;
    }
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar15->field_count_) {
    lVar21 = 0;
    lVar24 = 0;
    do {
      if (lVar24 < pDVar15->field_count_) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar24,(long)pDVar15->field_count_,"index < field_count()");
        pFVar17 = extraout_RDX_08;
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar16);
LAB_00e99520:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_1a0);
      }
      FieldConstantName_abi_cxx11_
                (&local_148,(java *)(&pDVar15->fields_->super_SymbolBase + lVar21),pFVar17);
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar22 = (long)pDVar15->field_count_;
      if (lVar24 < lVar22) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar24,lVar22,"index < field_count()");
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar16);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b8);
      }
      pcVar14 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                          (*(int32_t *)((long)&pDVar15->fields_->number_ + lVar21),
                           (Nonnull<char_*>)&local_190);
      local_1a0._0_8_ = pcVar14 + -(long)&local_190;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      local_1a0._8_8_ = (slot_type *)&local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,(slot_type *)&local_190,pcVar14);
      text_13._M_str = "public static final int $constant_name$ = $number$;\n";
      text_13._M_len = 0x34;
      io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,text_13,(char (*) [14])0x136f876,&local_148,(char (*) [7])0x11a6d37,
                 &local_128);
      if ((string_view *)local_128._M_dataplus._M_p != (string_view *)&local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                 local_128.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar22 = (long)pDVar15->field_count_;
      if (lVar24 < lVar22) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar24,lVar22,"index < field_count()");
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar16);
        goto LAB_00e99520;
      }
      begin_varname_04._M_str = "constant_name";
      begin_varname_04._M_len = 0xd;
      end_varname_04._M_str = "constant_name";
      end_varname_04._M_len = 0xd;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,begin_varname_04,end_varname_04,
                 (FieldDescriptor *)(&pDVar15->fields_->super_SymbolBase + lVar21),
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar22 = (long)pDVar15->field_count_;
      if (lVar24 < lVar22) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (lVar24,lVar22,"index < field_count()");
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_1a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar16);
        goto LAB_00e99520;
      }
      pIVar12 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                          (&this->field_generators_,
                           (FieldDescriptor *)(&pDVar15->fields_->super_SymbolBase + lVar21));
      (*(pIVar12->super_FieldGenerator)._vptr_FieldGenerator[8])(pIVar12,printer);
      text_14._M_str = "\n";
      text_14._M_len = 1;
      io::Printer::Print<>(printer,text_14);
      lVar24 = lVar24 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x58;
      pFVar17 = extraout_RDX_07;
    } while (lVar24 < pDVar15->field_count_);
  }
  bVar10 = Context::HasGeneratedMethods(this->context_,pDVar15);
  if (bVar10) {
    GenerateIsInitialized(this,printer);
    GenerateMessageSerializationMethods(this,printer);
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  pcVar25 = (((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_1a0._0_8_ = ZEXT28(*(ushort *)(pcVar25 + 2));
  local_1a0._8_8_ = pcVar25 + ~local_1a0._0_8_;
  text_15._M_str = "\n// @@protoc_insertion_point(class_scope:$full_name$)\n";
  text_15._M_len = 0x36;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_15,(char (*) [10])0x13f0d39,
             (basic_string_view<char,_std::char_traits<char>_> *)local_1a0);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_1a0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_16._M_str = "private static final $classname$ DEFAULT_INSTANCE;\n";
  text_16._M_len = 0x33;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_16,(char (*) [10])0x134d25a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
  if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_1a0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_17._M_str = "static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n";
  text_17._M_len = 0x34;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_17,(char (*) [10])0x134d25a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
  if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_1a0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_18._M_str =
       "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n";
  text_18._M_len = 0x4f;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_18,(char (*) [10])0x134d25a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
  if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  psVar8 = pDVar15->file_->name_;
  if ((psVar8->_M_string_length == 0x1e) &&
     (iVar18 = bcmp((psVar8->_M_dataplus)._M_p,"google/protobuf/wrappers.proto",0x1e), iVar18 == 0))
  {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_1a0,this->name_resolver_,pDVar15,true);
    pDVar15 = (this->super_MessageGenerator).descriptor_;
    lVar21 = (long)pDVar15->field_count_;
    if (lVar21 < 1) {
      pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (0,lVar21,"index < field_count()");
    }
    else {
      pcVar16 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar16 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_148,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar16);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_148);
    }
    type = GetJavaType(pDVar15->fields_);
    local_128._0_16_ = PrimitiveTypeName(type);
    text_19._M_str =
         "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
    ;
    text_19._M_len = 0x65;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
              (printer,text_19,(char (*) [10])0x134d25a,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [11])0x13a572d,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_128);
    if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
         *)local_1a0._0_8_ != &local_190) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
    }
  }
  puVar3 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_1a0._0_8_ = ZEXT28(*puVar3);
  local_1a0._8_8_ = (long)puVar3 + ~local_1a0._0_8_;
  text_20._M_str =
       "private static final com.google.protobuf.Parser<$classname$>\n    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n  @java.lang.Override\n  public $classname$ parsePartialFrom(\n      com.google.protobuf.CodedInputStream input,\n      com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n      throws com.google.protobuf.InvalidProtocolBufferException {\n    Builder builder = newBuilder();\n    try {\n      builder.mergeFrom(input, extensionRegistry);\n    } catch (com.google.protobuf.InvalidProtocolBufferException e) {\n      throw e.setUnfinishedMessage(builder.buildPartial());\n    } catch (com.google.protobuf.UninitializedMessageException e) {\n      throw e.asInvalidProtocolBufferException().setUnfinishedMessage(builder.buildPartial());\n    } catch (java.io.IOException e) {\n      throw new com.google.protobuf.InvalidProtocolBufferException(e)\n          .setUnfinishedMessage(builder.buildPartial());\n    }\n    return builder.buildPartial();\n  }\n};\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return PARSER;\n}\n\n@java.lang.Override\npublic com.google.protobuf.Parser<$classname$> getParserForType() {\n  return PARSER;\n}\n\n"
  ;
  text_20._M_len = 0x492;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_20,(char (*) [10])0x134d25a,
             (basic_string_view<char,_std::char_traits<char>_> *)local_1a0);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_1a0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  text_21._M_str =
       "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
  ;
  text_21._M_len = 99;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_21,(char (*) [10])0x134d25a,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
  if ((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,
                    CONCAT71(local_190.root_._1_7_,local_190.root_._0_1_) + 1);
  }
  pDVar15 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar15->extension_count_) {
    lVar21 = 0;
    lVar24 = 0;
    do {
      ImmutableExtensionGenerator::ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)local_1a0,
                 (FieldDescriptor *)(&pDVar15->extensions_->super_SymbolBase + lVar21),
                 this->context_);
      ImmutableExtensionGenerator::Generate((ImmutableExtensionGenerator *)local_1a0,printer);
      ImmutableExtensionGenerator::~ImmutableExtensionGenerator
                ((ImmutableExtensionGenerator *)local_1a0);
      lVar24 = lVar24 + 1;
      pDVar15 = (this->super_MessageGenerator).descriptor_;
      lVar21 = lVar21 + 0x58;
    } while (lVar24 < pDVar15->extension_count_);
  }
  io::Printer::Outdent(printer);
  text_22._M_str = "}\n\n";
  text_22._M_len = 3;
  io::Printer::Print<>(printer,text_22);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_a8);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  absl::flat_hash_map<absl::string_view, std::string> variables;
  variables["static"] = is_own_file ? "" : "static ";
  variables["classname"] = std::string(descriptor_->name());
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = absl::Substitute(
        "com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type = "com.google.protobuf.GeneratedMessage.Builder<?>";
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();

  printer->Print("static {\n");
  printer->Indent();
  PrintGencodeVersionValidator(printer, context_->options().opensource_runtime,
                               descriptor_->name());
  printer->Outdent();
  printer->Print("}\n");

  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumNonLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  absl::flat_hash_map<absl::string_view, std::string> vars;
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = absl::StrCat((oneof)->index());
    vars["{"] = "";
    vars["}"] = "";
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "@SuppressWarnings(\"serial\")\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum ${$$oneof_capitalized_name$Case$}$\n"
        // TODO: Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Annotate("{", "}", oneof);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", absl::AsciiStrToUpper(field->name()), "field_number",
          absl::StrCat(field->number()));
      printer->Annotate("field_name", field);
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    if (context_->options().opensource_runtime) {
      printer->Print(
          vars,
          "/**\n"
          " * @param value The number of the enum to look for.\n"
          " * @return The enum associated with the given number.\n"
          " * @deprecated Use {@link #forNumber(int)} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
          "  return forNumber(value);\n"
          "}\n"
          "\n");
    }
    if (!context_->options().opensource_runtime) {
      printer->Print(
          "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
    }
    printer->Print(
        vars,
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", absl::StrCat(field->number()),
                     "field_name", absl::AsciiStrToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "${$get$oneof_capitalized_name$Case$}$() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
    printer->Annotate("{", "}", oneof);
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", absl::StrCat(descriptor_->field(i)->number()));
    printer->Annotate("constant_name", descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}